

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

bool __thiscall HModel::workArrays_OK(HModel *this,int phase)

{
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  ulong uVar6;
  char *__format;
  double dVar7;
  
  pdVar3 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (phase == 1) {
    pdVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    uVar2 = this->numCol;
    pdVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar1 = pdVar3[uVar6];
      if (-1e+200 < dVar1) {
        dVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if ((dVar1 != dVar7) || (NAN(dVar1) || NAN(dVar7))) goto LAB_0012f938;
      }
      dVar1 = pdVar4[uVar6];
      if (dVar1 < 1e+200) {
        dVar7 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if ((dVar1 != dVar7) || (NAN(dVar1) || NAN(dVar7))) {
          __format = "For col %d, workUpper should be %g but is %g\n";
          goto LAB_0012f93f;
        }
      }
    }
    uVar5 = 0;
    uVar6 = (ulong)(uint)this->numRow;
    if (this->numRow < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = pdVar3[(long)(int)uVar2 + uVar5];
      if (-1e+200 < dVar1) {
        dVar7 = -(this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
        if ((dVar1 != dVar7) || (NAN(dVar1) || NAN(dVar7))) {
          __format = "For row %d, workLower should be %g but is %g\n";
          goto LAB_0012f93f;
        }
      }
      dVar1 = pdVar4[(long)(int)uVar2 + uVar5];
      if (dVar1 < 1e+200) {
        dVar7 = -(this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
        if ((dVar1 != dVar7) || (NAN(dVar1) || NAN(dVar7))) {
          __format = "For row %d, workUpper should be %g but is %g\n";
          goto LAB_0012f93f;
        }
      }
    }
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)this->numTot;
  if (this->numTot < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    dVar1 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    if ((dVar1 != pdVar4[uVar5] - pdVar3[uVar5]) ||
       (NAN(dVar1) || NAN(pdVar4[uVar5] - pdVar3[uVar5]))) {
      printf("For variable %d, workRange should be %g = %g - %g but is %g\n");
      return false;
    }
  }
  if (this->problemPerturbed == 0) {
    uVar2 = this->numCol;
    pdVar3 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      dVar7 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] * (double)this->objSense;
      dVar1 = pdVar3[uVar6];
      if ((dVar1 != dVar7) || (NAN(dVar1) || NAN(dVar7))) {
        dVar7 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
LAB_0012f938:
        __format = "For col %d, workLower should be %g but is %g\n";
LAB_0012f93f:
        printf(__format,dVar7);
        return false;
      }
    }
    uVar5 = 0;
    uVar6 = (ulong)(uint)this->numRow;
    if (this->numRow < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = pdVar3[(long)(int)uVar2 + uVar5];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        printf("For row %d, workCost should be zero but is %g\n");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool HModel::workArrays_OK(int phase) {
  //  printf("Called workArrays_OK(%d)\n", phase);cout << flush;
  bool ok = true;
  //Don't check phase 1 bounds: these will have been set by solve() so can be trusted
  if (phase != 1) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == colLower[col];
	if (!ok) {
	  printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == colUpper[col];
	if (!ok) {
	  printf("For col %d, workUpper should be %g but is %g\n", col, colUpper[col], workUpper[var]);
	  return ok;
	}
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      if (!hsol_isInfinity(-workLower[var])) {
	ok = workLower[var] == -rowUpper[row];
	if (!ok) {
	  printf("For row %d, workLower should be %g but is %g\n", row, -rowUpper[row], workLower[var]);
	  return ok;
	}
      }
      if (!hsol_isInfinity(workUpper[var])) {
	ok = workUpper[var] == -rowLower[row];
	if (!ok) {
	  printf("For row %d, workUpper should be %g but is %g\n", row, -rowLower[row], workUpper[var]);
	  return ok;
	}
      }
    }
  }
  for (int var = 0; var < numTot; ++var) {
    ok = workRange[var] == (workUpper[var] - workLower[var]);
    if (!ok) {
      printf("For variable %d, workRange should be %g = %g - %g but is %g\n",
	     var, workUpper[var] - workLower[var], workUpper[var], workLower[var], workRange[var]);
      return ok;
    }
  }
  //Don't check perturbed costs: these will have been set by solve() so can be trusted
  if (!problemPerturbed) {
    for (int col = 0; col < numCol; ++col) {
      int var = col;
      double sense_col_cost = objSense*colCost[col];
      ok = workCost[var] == sense_col_cost;
      if (!ok) {
	printf("For col %d, workLower should be %g but is %g\n", col, colLower[col], workCost[var]);
	return ok;
      }
    }
    for (int row = 0; row < numRow; ++row) {
      int var = numCol + row;
      ok = workCost[var] == 0.;
      if (!ok) {
	printf("For row %d, workCost should be zero but is %g\n", row, workCost[var]);
	return ok;
      }
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}